

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslGrammar.cpp
# Opt level: O2

bool __thiscall
glslang::HlslGrammar::acceptStructDeclarationList
          (HlslGrammar *this,TTypeList **typeList,TIntermNode **nodeList,
          TVector<glslang::TFunctionDeclarator> *declarators)

{
  HlslToken *loc;
  vector<glslang::TFunctionDeclarator,_glslang::pool_allocator<glslang::TFunctionDeclarator>_>
  *pvVar1;
  TTypeList **ppTVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  TVector<glslang::TTypeLoc> *this_00;
  TType *this_01;
  undefined4 extraout_var;
  _List_node_header *p_Var7;
  size_t s;
  char *syntax;
  TArraySizes *arraySizes;
  vector<glslang::TFunctionDeclarator,_glslang::pool_allocator<glslang::TFunctionDeclarator>_>
  *local_150;
  TTypeList **local_148;
  TIntermTyped *expressionNode;
  TAttributes attributes;
  TTypeLoc member;
  HlslToken idToken;
  TType memberType;
  
  local_150 = &declarators->
               super_vector<glslang::TFunctionDeclarator,_glslang::pool_allocator<glslang::TFunctionDeclarator>_>
  ;
  this_00 = (TVector<glslang::TTypeLoc> *)
            TVector<glslang::TTypeLoc>::operator_new
                      ((TVector<glslang::TTypeLoc> *)0x20,(size_t)typeList);
  TVector<glslang::TTypeLoc>::TVector(this_00);
  *typeList = this_00;
  idToken.field_2.string = (TString *)0x0;
  idToken.loc.name = (TString *)0x0;
  idToken.loc.string = 0;
  idToken.loc.line = 0;
  idToken.loc.column = 0;
  loc = &(this->super_HlslTokenStream).token;
  local_148 = typeList;
LAB_00333eaf:
  do {
    p_Var7 = &attributes.
              super_list<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>
              .
              super__List_base<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>
              ._M_impl._M_node;
    bVar3 = HlslTokenStream::peekTokenClass(&this->super_HlslTokenStream,EHTokRightBrace);
    if (bVar3) {
      return bVar3;
    }
    attributes.
    super_list<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>.
    super__List_base<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>.
    _M_impl.super__Node_alloc_type.allocator = GetThreadPoolAllocator();
    attributes.
    super_list<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>.
    super__List_base<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>.
    _M_impl._M_node._M_size = 0;
    attributes.
    super_list<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>.
    super__List_base<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>.
    _M_impl._M_node.super__List_node_base._M_next = &p_Var7->super__List_node_base;
    attributes.
    super_list<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>.
    super__List_base<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>.
    _M_impl._M_node.super__List_node_base._M_prev = &p_Var7->super__List_node_base;
    acceptAttributes(this,&attributes);
    TType::TType(&memberType,EbtVoid,EvqTemporary,1,0,0,false);
    bVar4 = acceptFullySpecifiedType(this,&memberType,nodeList,&attributes,false);
    if (!bVar4) {
      syntax = "member type";
LAB_0033415c:
      expected(this,syntax);
      return bVar3;
    }
    bVar4 = false;
    HlslParseContext::transferTypeAttributes
              (this->parseContext,&loc->loc,&attributes,&memberType,false);
    ppTVar2 = local_148;
    while( true ) {
      bVar5 = acceptIdentifier(this,&idToken);
      if (!bVar5) {
        syntax = "member name";
        goto LAB_0033415c;
      }
      s = 0x163;
      bVar5 = HlslTokenStream::peekTokenClass(&this->super_HlslTokenStream,EHTokLeftParen);
      pvVar1 = local_150;
      if (bVar5) {
        if (!bVar4) {
          std::
          vector<glslang::TFunctionDeclarator,_glslang::pool_allocator<glslang::TFunctionDeclarator>_>
          ::resize(local_150,
                   ((long)(local_150->
                          super__Vector_base<glslang::TFunctionDeclarator,_glslang::pool_allocator<glslang::TFunctionDeclarator>_>
                          )._M_impl.super__Vector_impl_data._M_finish -
                   (long)(local_150->
                         super__Vector_base<glslang::TFunctionDeclarator,_glslang::pool_allocator<glslang::TFunctionDeclarator>_>
                         )._M_impl.super__Vector_impl_data._M_start) / 0x48 + 1);
          bVar4 = acceptMemberFunctionDefinition
                            (this,nodeList,&memberType,idToken.field_2.string,
                             (pvVar1->
                             super__Vector_base<glslang::TFunctionDeclarator,_glslang::pool_allocator<glslang::TFunctionDeclarator>_>
                             )._M_impl.super__Vector_impl_data._M_finish + -1);
          if (bVar4) goto LAB_00333eaf;
        }
        syntax = "member-function definition";
        goto LAB_0033415c;
      }
      this_01 = (TType *)TType::operator_new((TType *)0x98,s);
      TType::TType(this_01,EbtVoid,EvqTemporary,1,0,0,false);
      member.loc.column = (this->super_HlslTokenStream).token.loc.column;
      member.loc._20_4_ = *(undefined4 *)&(this->super_HlslTokenStream).token.loc.field_0x14;
      member.loc.name = (loc->loc).name;
      member.loc.string = (this->super_HlslTokenStream).token.loc.string;
      member.loc.line = (this->super_HlslTokenStream).token.loc.line;
      member.type = this_01;
      TType::shallowCopy(this_01,&memberType);
      (*(member.type)->_vptr_TType[4])(member.type,idToken.field_2.string);
      std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::push_back
                (&(*ppTVar2)->
                  super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>,
                 &member);
      arraySizes = (TArraySizes *)0x0;
      acceptArraySpecifier(this,&arraySizes);
      if (arraySizes != (TArraySizes *)0x0) {
        (((*ppTVar2)->super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
         super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>._M_impl.
         super__Vector_impl_data._M_finish[-1].type)->arraySizes = arraySizes;
      }
      iVar6 = (*(member.type)->_vptr_TType[10])();
      acceptPostDecls(this,(TQualifier *)CONCAT44(extraout_var,iVar6));
      bVar4 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokAssign);
      if (bVar4) {
        (*(this->parseContext->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions
          [0x2e])(this->parseContext,&idToken,"struct-member initializers ignored","typedef");
        expressionNode = (TIntermTyped *)0x0;
        bVar4 = acceptAssignmentExpression(this,&expressionNode);
        if (!bVar4) {
          syntax = "initializer";
          goto LAB_0033415c;
        }
      }
      bVar4 = HlslTokenStream::peekTokenClass(&this->super_HlslTokenStream,EHTokSemicolon);
      if (bVar4) break;
      bVar5 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokComma);
      bVar4 = true;
      if (!bVar5) {
        syntax = ",";
        goto LAB_0033415c;
      }
    }
    bVar4 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokSemicolon);
  } while (bVar4);
  syntax = ";";
  goto LAB_0033415c;
}

Assistant:

bool HlslGrammar::acceptStructDeclarationList(TTypeList*& typeList, TIntermNode*& nodeList,
                                              TVector<TFunctionDeclarator>& declarators)
{
    typeList = new TTypeList();
    HlslToken idToken;

    do {
        // success on seeing the RIGHT_BRACE coming up
        if (peekTokenClass(EHTokRightBrace))
            break;

        // struct_declaration

        // attributes
        TAttributes attributes;
        acceptAttributes(attributes);

        bool declarator_list = false;

        // fully_specified_type
        TType memberType;
        if (! acceptFullySpecifiedType(memberType, nodeList, attributes)) {
            expected("member type");
            return false;
        }
        
        // merge in the attributes
        parseContext.transferTypeAttributes(token.loc, attributes, memberType);

        // struct_declarator COMMA struct_declarator ...
        bool functionDefinitionAccepted = false;
        do {
            if (! acceptIdentifier(idToken)) {
                expected("member name");
                return false;
            }

            if (peekTokenClass(EHTokLeftParen)) {
                // function_parameters
                if (!declarator_list) {
                    declarators.resize(declarators.size() + 1);
                    // request a token stream for deferred processing
                    functionDefinitionAccepted = acceptMemberFunctionDefinition(nodeList, memberType, *idToken.string,
                                                                                declarators.back());
                    if (functionDefinitionAccepted)
                        break;
                }
                expected("member-function definition");
                return false;
            } else {
                // add it to the list of members
                TTypeLoc member = { new TType(EbtVoid), token.loc };
                member.type->shallowCopy(memberType);
                member.type->setFieldName(*idToken.string);
                typeList->push_back(member);

                // array_specifier
                TArraySizes* arraySizes = nullptr;
                acceptArraySpecifier(arraySizes);
                if (arraySizes)
                    typeList->back().type->transferArraySizes(arraySizes);

                acceptPostDecls(member.type->getQualifier());

                // EQUAL assignment_expression
                if (acceptTokenClass(EHTokAssign)) {
                    parseContext.warn(idToken.loc, "struct-member initializers ignored", "typedef", "");
                    TIntermTyped* expressionNode = nullptr;
                    if (! acceptAssignmentExpression(expressionNode)) {
                        expected("initializer");
                        return false;
                    }
                }
            }
            // success on seeing the SEMICOLON coming up
            if (peekTokenClass(EHTokSemicolon))
                break;

            // COMMA
            if (acceptTokenClass(EHTokComma))
                declarator_list = true;
            else {
                expected(",");
                return false;
            }

        } while (true);

        // SEMI_COLON
        if (! functionDefinitionAccepted && ! acceptTokenClass(EHTokSemicolon)) {
            expected(";");
            return false;
        }

    } while (true);

    return true;
}